

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall COLLADASaxFWL::KinematicLink::~KinematicLink(KinematicLink *this)

{
  ~KinematicLink(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~KinematicLink(){ deleteVector(mAttachments); deleteVector(mTransformations); }